

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::ServiceDescriptor::CopyTo(ServiceDescriptor *this,ServiceDescriptorProto *proto)

{
  long lVar1;
  MethodDescriptorProto *proto_00;
  ServiceOptions *pSVar2;
  ServiceOptions *pSVar3;
  int i;
  long lVar4;
  long lVar5;
  
  ServiceDescriptorProto::_internal_set_name(proto,*(string **)this);
  lVar5 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(this + 0x28); lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(this + 0x20);
    proto_00 = RepeatedPtrField<google::protobuf::MethodDescriptorProto>::Add(&proto->method_);
    MethodDescriptor::CopyTo((MethodDescriptor *)(lVar1 + lVar5),proto_00);
    lVar5 = lVar5 + 0x68;
  }
  pSVar3 = *(ServiceOptions **)(this + 0x18);
  pSVar2 = ServiceOptions::default_instance();
  if (pSVar3 != pSVar2) {
    pSVar3 = ServiceDescriptorProto::_internal_mutable_options(proto);
    ServiceOptions::CopyFrom(pSVar3,*(ServiceOptions **)(this + 0x18));
    return;
  }
  return;
}

Assistant:

void ServiceDescriptor::CopyTo(ServiceDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < method_count(); i++) {
    method(i)->CopyTo(proto->add_method());
  }

  if (&options() != &ServiceOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}